

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O0

void ncnn::pack_B_tile(Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int kk_13;
  float *p0_10;
  __m128 _tmp1_4;
  __m128 _tmp0_4;
  __m128 _r1_7;
  __m128 _r0_7;
  __m256 _r1_6;
  __m256 _r0_6;
  int kk_12;
  float *p1_7;
  float *p0_9;
  __m128 tmp0_5;
  __m128 tmp1_5;
  __m128 tmp2_5;
  __m128 tmp3_5;
  __m128 _r3_5;
  __m128 _r2_5;
  __m128 _r1_5;
  __m128 _r0_5;
  __m256 _r3_4;
  __m256 _r2_4;
  __m256 _r1_4;
  __m256 _r0_4;
  int kk_11;
  float *p3_2;
  float *p2_3;
  float *p1_6;
  float *p0_8;
  int kk_10;
  float *p0_7;
  int kk_9;
  int kk_8;
  float *p0_6;
  __m128 tmp0_4;
  __m128 tmp1_4;
  __m128 tmp2_4;
  __m128 tmp3_4;
  __m128 tmp0_3;
  __m128 tmp1_3;
  __m128 tmp2_3;
  __m128 tmp3_3;
  __m128 _r7_3;
  __m128 _r6_3;
  __m128 _r5_3;
  __m128 _r4_3;
  __m128 _r3_3;
  __m128 _r2_3;
  __m128 _r1_3;
  __m128 _r0_3;
  __m256 _r7_2;
  __m256 _r6_2;
  __m256 _r5_2;
  __m256 _r4_2;
  __m256 _r3_2;
  __m256 _r2_2;
  __m256 _r1_2;
  __m256 _r0_2;
  int kk_7;
  float *p7_1;
  float *p6_1;
  float *p5_1;
  float *p4_1;
  float *p3_1;
  float *p2_2;
  float *p1_5;
  float *p0_5;
  int kk_6;
  float *p1_4;
  float *p0_4;
  int kk_5;
  int kk_4;
  float *p1_3;
  float *p0_3;
  __m128 tmp0_2;
  __m128 tmp1_2;
  __m128 tmp2_2;
  __m128 tmp3_2;
  __m128 tmp0_1;
  __m128 tmp1_1;
  __m128 tmp2_1;
  __m128 tmp3_1;
  __m128 tmp0;
  __m128 tmp1;
  __m128 tmp2;
  __m128 tmp3;
  __m128 _rb_1;
  __m128 _ra_1;
  __m128 _r9_1;
  __m128 _r8_1;
  __m128 _r7_1;
  __m128 _r6_1;
  __m128 _r5_1;
  __m128 _r4_1;
  __m128 _r3_1;
  __m128 _r2_1;
  __m128 _r1_1;
  __m128 _r0_1;
  __m256 _rb;
  __m256 _ra;
  __m256 _r9;
  __m256 _r8;
  __m256 _r7;
  __m256 _r6;
  __m256 _r5;
  __m256 _r4;
  __m256 _r3;
  __m256 _r2;
  __m256 _r1;
  __m256 _r0;
  int kk_3;
  float *pb;
  float *pa;
  float *p9;
  float *p8;
  float *p7;
  float *p6;
  float *p5;
  float *p4;
  float *p3;
  float *p2_1;
  float *p1_2;
  float *p0_2;
  int kk_2;
  float *p2;
  float *p1_1;
  float *p0_1;
  int kk_1;
  int kk;
  float *p1;
  float *p0;
  int jj;
  float *pp;
  int B_hstep;
  int elempack;
  __m256 _tmpf_1;
  __m256 _tmpe_1;
  __m256 _tmpd_1;
  __m256 _tmpc_1;
  __m256 _tmpb_1;
  __m256 _tmpa_1;
  __m256 _tmp9_1;
  __m256 _tmp8_1;
  __m256 _tmp7_1;
  __m256 _tmp6_1;
  __m256 _tmp5_1;
  __m256 _tmp4_1;
  __m256 _tmp3_1;
  __m256 _tmp2_1;
  __m256 _tmp1_1;
  __m256 _tmp0_1;
  __m256 _tmp7_2;
  __m256 _tmp6_2;
  __m256 _tmp5_2;
  __m256 _tmp4_2;
  __m256 _tmp3_2;
  __m256 _tmp2_2;
  __m256 _tmp1_2;
  __m256 _tmp0_2;
  __m256 _tmp1_3;
  __m256 _tmp0_3;
  __m256 _tmpn;
  __m256 _tmpm;
  __m256 _tmpl;
  __m256 _tmpk;
  __m256 _tmpj;
  __m256 _tmpi;
  __m256 _tmph;
  __m256 _tmpg;
  __m256 _tmpf;
  __m256 _tmpe;
  __m256 _tmpd;
  __m256 _tmpc;
  __m256 _tmpb;
  __m256 _tmpa;
  __m256 _tmp9;
  __m256 _tmp8;
  __m256 _tmp7;
  __m256 _tmp6;
  __m256 _tmp5;
  __m256 _tmp4;
  __m256 _tmp3;
  __m256 _tmp2;
  __m256 _tmp1;
  __m256 _tmp0;
  int local_2c70;
  int local_2c6c;
  undefined1 (*local_2c68) [32];
  undefined8 local_2c50;
  undefined8 uStack_2c48;
  int local_2bd4;
  undefined1 (*local_2bd0) [32];
  undefined1 (*local_2bc8) [32];
  undefined8 local_2b70;
  undefined8 uStack_2b68;
  undefined8 local_2b60;
  undefined8 uStack_2b58;
  undefined8 local_2b50;
  undefined8 uStack_2b48;
  undefined8 local_2b20;
  undefined8 uStack_2b18;
  undefined8 uStack_2b10;
  undefined8 uStack_2b08;
  int local_2aa4;
  undefined1 (*local_2aa0) [32];
  undefined1 (*local_2a98) [32];
  undefined1 (*local_2a90) [32];
  undefined1 (*local_2a88) [32];
  int local_2a7c;
  undefined1 (*local_2a78) [16];
  int local_2a70;
  int local_2a6c;
  undefined1 (*local_2a68) [16];
  undefined8 local_29d0;
  undefined8 uStack_29c8;
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 local_29b0;
  undefined8 uStack_29a8;
  undefined8 local_29a0;
  undefined8 uStack_2998;
  undefined8 local_2990;
  undefined8 uStack_2988;
  undefined8 local_2980;
  undefined8 uStack_2978;
  undefined8 local_2970;
  undefined8 uStack_2968;
  undefined8 local_2940;
  undefined8 uStack_2938;
  undefined8 uStack_2930;
  undefined8 uStack_2928;
  undefined8 local_2920;
  undefined8 uStack_2918;
  undefined8 uStack_2910;
  undefined8 uStack_2908;
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  int local_2854;
  undefined1 (*local_2850) [32];
  undefined1 (*local_2848) [32];
  undefined1 (*local_2840) [32];
  undefined1 (*local_2838) [32];
  undefined1 (*local_2830) [32];
  undefined1 (*local_2828) [32];
  undefined1 (*local_2820) [32];
  undefined1 (*local_2818) [32];
  int local_280c;
  undefined1 (*local_2808) [16];
  undefined8 *local_2800;
  int local_27f8;
  int local_27f4;
  undefined1 (*local_27f0) [16];
  undefined1 (*local_27e8) [32];
  undefined8 local_2710;
  undefined8 uStack_2708;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 local_26f0;
  undefined8 uStack_26e8;
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  undefined8 local_26d0;
  undefined8 uStack_26c8;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 local_26b0;
  undefined8 uStack_26a8;
  undefined8 local_26a0;
  undefined8 uStack_2698;
  undefined8 local_2690;
  undefined8 uStack_2688;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 local_2670;
  undefined8 uStack_2668;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined8 local_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined8 local_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  int local_24c4;
  undefined1 (*local_24c0) [32];
  undefined1 (*local_24b8) [32];
  undefined1 (*local_24b0) [32];
  undefined1 (*local_24a8) [32];
  undefined1 (*local_24a0) [32];
  undefined1 (*local_2498) [32];
  undefined1 (*local_2490) [32];
  undefined1 (*local_2488) [32];
  undefined1 (*local_2480) [32];
  undefined1 (*local_2478) [32];
  undefined1 (*local_2470) [32];
  undefined1 (*local_2468) [32];
  int local_245c;
  undefined1 (*local_2458) [16];
  undefined8 *local_2450;
  undefined8 *local_2448;
  int local_2440;
  int local_243c;
  undefined1 (*local_2438) [32];
  undefined8 *local_2430;
  int local_2424;
  undefined1 (*local_2420) [32];
  undefined8 local_22a0;
  undefined8 uStack_2298;
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined8 local_2260;
  undefined8 uStack_2258;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 local_2220;
  undefined8 uStack_2218;
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 local_21e0;
  undefined8 uStack_21d8;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_540;
  undefined8 uStack_538;
  
  iVar1 = (int)in_RDI[3];
  if ((int)in_RDI[5] == 3) {
    local_2c70 = (int)in_RDI[8];
  }
  else {
    local_2c70 = *(int *)((long)in_RDI + 0x2c);
  }
  local_2420 = (undefined1 (*) [32])*in_RSI;
  for (local_2424 = 0; local_2424 + 0xb < in_ECX; local_2424 = local_2424 + 0xc) {
    if (iVar1 == 8) {
      local_2430 = (undefined8 *)
                   (*in_RDI + (long)(((in_EDX + local_2424) / 8) * 8 * local_2c70) * 4 +
                   (long)(in_R8D << 3) * 4);
      local_2438 = (undefined1 (*) [32])
                   (*in_RDI + (long)((((in_EDX + local_2424) / 8) * 8 + 8) * local_2c70) * 4 +
                   (long)(in_R8D << 3) * 4);
      if ((in_EDX + local_2424) % 8 == 0) {
        for (local_243c = 0; local_243c < in_R9D; local_243c = local_243c + 1) {
          uVar29 = local_2430[1];
          uVar30 = local_2430[2];
          uVar31 = local_2430[3];
          *(undefined8 *)*local_2420 = *local_2430;
          *(undefined8 *)(*local_2420 + 8) = uVar29;
          *(undefined8 *)(*local_2420 + 0x10) = uVar30;
          *(undefined8 *)(*local_2420 + 0x18) = uVar31;
          *(undefined1 (*) [16])local_2420[1] = *(undefined1 (*) [16])*local_2438;
          local_2420 = (undefined1 (*) [32])(local_2420[1] + 0x10);
          local_2430 = local_2430 + 4;
          local_2438 = local_2438 + 1;
        }
      }
      if ((in_EDX + local_2424) % 8 == 4) {
        for (local_2440 = 0; local_2440 < in_R9D; local_2440 = local_2440 + 1) {
          uVar29 = local_2430[3];
          *(undefined8 *)*local_2420 = local_2430[2];
          *(undefined8 *)(*local_2420 + 8) = uVar29;
          *(undefined1 (*) [32])(*local_2420 + 0x10) = *local_2438;
          local_2420 = (undefined1 (*) [32])(local_2420[1] + 0x10);
          local_2430 = local_2430 + 4;
          local_2438 = local_2438 + 1;
        }
      }
    }
    if (iVar1 == 4) {
      local_2448 = (undefined8 *)
                   (*in_RDI + (long)((in_EDX + local_2424) * local_2c70) * 4 +
                   (long)(in_R8D << 2) * 4);
      local_2450 = (undefined8 *)
                   (*in_RDI + (long)((in_EDX + local_2424 + 4) * local_2c70) * 4 +
                   (long)(in_R8D << 2) * 4);
      local_2458 = (undefined1 (*) [16])
                   (*in_RDI + (long)((in_EDX + local_2424 + 8) * local_2c70) * 4 +
                   (long)(in_R8D << 2) * 4);
      for (local_245c = 0; local_245c < in_R9D; local_245c = local_245c + 1) {
        uVar29 = local_2448[1];
        *(undefined8 *)*local_2420 = *local_2448;
        *(undefined8 *)(*local_2420 + 8) = uVar29;
        uVar29 = local_2450[1];
        *(undefined8 *)(*local_2420 + 0x10) = *local_2450;
        *(undefined8 *)(*local_2420 + 0x18) = uVar29;
        *(undefined1 (*) [16])local_2420[1] = *local_2458;
        local_2420 = (undefined1 (*) [32])(local_2420[1] + 0x10);
        local_2448 = local_2448 + 2;
        local_2450 = local_2450 + 2;
        local_2458 = local_2458 + 1;
      }
    }
    if (iVar1 == 1) {
      local_2468 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_2424) * local_2c70) * 4 + (long)in_R8D * 4);
      local_2470 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_2424 + 1) * local_2c70) * 4 + (long)in_R8D * 4)
      ;
      local_2478 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_2424 + 2) * local_2c70) * 4 + (long)in_R8D * 4)
      ;
      local_2480 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_2424 + 3) * local_2c70) * 4 + (long)in_R8D * 4)
      ;
      local_2488 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_2424 + 4) * local_2c70) * 4 + (long)in_R8D * 4)
      ;
      local_2490 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_2424 + 5) * local_2c70) * 4 + (long)in_R8D * 4)
      ;
      local_2498 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_2424 + 6) * local_2c70) * 4 + (long)in_R8D * 4)
      ;
      local_24a0 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_2424 + 7) * local_2c70) * 4 + (long)in_R8D * 4)
      ;
      local_24a8 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_2424 + 8) * local_2c70) * 4 + (long)in_R8D * 4)
      ;
      local_24b0 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_2424 + 9) * local_2c70) * 4 + (long)in_R8D * 4)
      ;
      local_24b8 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_2424 + 10) * local_2c70) * 4 + (long)in_R8D * 4
                   );
      local_24c0 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_2424 + 0xb) * local_2c70) * 4 +
                   (long)in_R8D * 4);
      for (local_24c4 = 0; local_24c4 + 7 < in_R9D; local_24c4 = local_24c4 + 8) {
        auVar23 = vunpcklps_avx(*local_2468,*local_2470);
        auVar6 = vunpckhps_avx(*local_2468,*local_2470);
        auVar24 = vunpcklps_avx(*local_2478,*local_2480);
        auVar7 = vunpckhps_avx(*local_2478,*local_2480);
        auVar25 = vunpcklps_avx(*local_2488,*local_2490);
        auVar8 = vunpckhps_avx(*local_2488,*local_2490);
        auVar26 = vunpcklps_avx(*local_2498,*local_24a0);
        auVar9 = vunpckhps_avx(*local_2498,*local_24a0);
        auVar27 = vunpcklps_avx(*local_24a8,*local_24b0);
        auVar10 = vunpckhps_avx(*local_24a8,*local_24b0);
        auVar28 = vunpcklps_avx(*local_24b8,*local_24c0);
        auVar11 = vunpckhps_avx(*local_24b8,*local_24c0);
        auVar17 = vunpcklpd_avx(auVar23,auVar24);
        auVar23 = vunpckhpd_avx(auVar23,auVar24);
        auVar24 = vunpcklpd_avx(auVar6,auVar7);
        auVar6 = vunpckhpd_avx(auVar6,auVar7);
        auVar18 = vunpcklpd_avx(auVar25,auVar26);
        auVar7 = vunpckhpd_avx(auVar25,auVar26);
        auVar25 = vunpcklpd_avx(auVar8,auVar9);
        auVar8 = vunpckhpd_avx(auVar8,auVar9);
        auVar26 = vunpcklpd_avx(auVar27,auVar28);
        auVar9 = vunpckhpd_avx(auVar27,auVar28);
        auVar27 = vunpcklpd_avx(auVar10,auVar11);
        auVar10 = vunpckhpd_avx(auVar10,auVar11);
        local_540 = auVar17._0_8_;
        uStack_538 = auVar17._8_8_;
        local_5c0 = auVar18._0_8_;
        uStack_5b8 = auVar18._8_8_;
        local_640 = auVar26._0_8_;
        uStack_638 = auVar26._8_8_;
        local_560 = auVar23._0_8_;
        uStack_558 = auVar23._8_8_;
        local_5e0 = auVar7._0_8_;
        uStack_5d8 = auVar7._8_8_;
        local_660 = auVar9._0_8_;
        uStack_658 = auVar9._8_8_;
        local_580 = auVar24._0_8_;
        uStack_578 = auVar24._8_8_;
        local_600 = auVar25._0_8_;
        uStack_5f8 = auVar25._8_8_;
        local_680 = auVar27._0_8_;
        uStack_678 = auVar27._8_8_;
        local_5a0 = auVar6._0_8_;
        uStack_598 = auVar6._8_8_;
        local_620 = auVar8._0_8_;
        uStack_618 = auVar8._8_8_;
        local_6a0 = auVar10._0_8_;
        uStack_698 = auVar10._8_8_;
        auVar11 = vperm2f128_avx(auVar17,auVar18,0x31);
        uStack_25a8 = auVar11._24_8_;
        uStack_25b0 = auVar11._16_8_;
        uStack_25b8 = auVar11._8_8_;
        local_25c0 = auVar11._0_8_;
        auVar23 = vperm2f128_avx(auVar26,auVar23,0x31);
        uStack_25c8 = auVar23._24_8_;
        uStack_25d0 = auVar23._16_8_;
        uStack_25d8 = auVar23._8_8_;
        local_25e0 = auVar23._0_8_;
        auVar23 = vperm2f128_avx(auVar7,auVar9,0x31);
        uStack_25e8 = auVar23._24_8_;
        uStack_25f0 = auVar23._16_8_;
        uStack_25f8 = auVar23._8_8_;
        local_2600 = auVar23._0_8_;
        auVar23 = vperm2f128_avx(auVar24,auVar25,0x31);
        uStack_2608 = auVar23._24_8_;
        uStack_2610 = auVar23._16_8_;
        uStack_2618 = auVar23._8_8_;
        local_2620 = auVar23._0_8_;
        auVar23 = vperm2f128_avx(auVar27,auVar6,0x31);
        uStack_2628 = auVar23._24_8_;
        uStack_2630 = auVar23._16_8_;
        uStack_2638 = auVar23._8_8_;
        local_2640 = auVar23._0_8_;
        auVar23 = vperm2f128_avx(auVar8,auVar10,0x31);
        *(undefined8 *)*local_2420 = local_540;
        *(undefined8 *)(*local_2420 + 8) = uStack_538;
        *(undefined8 *)(*local_2420 + 0x10) = local_5c0;
        *(undefined8 *)(*local_2420 + 0x18) = uStack_5b8;
        *(undefined8 *)local_2420[1] = local_640;
        *(undefined8 *)(local_2420[1] + 8) = uStack_638;
        *(undefined8 *)(local_2420[1] + 0x10) = local_560;
        *(undefined8 *)(local_2420[1] + 0x18) = uStack_558;
        *(undefined8 *)local_2420[2] = local_5e0;
        *(undefined8 *)(local_2420[2] + 8) = uStack_5d8;
        *(undefined8 *)(local_2420[2] + 0x10) = local_660;
        *(undefined8 *)(local_2420[2] + 0x18) = uStack_658;
        *(undefined8 *)local_2420[3] = local_580;
        *(undefined8 *)(local_2420[3] + 8) = uStack_578;
        *(undefined8 *)(local_2420[3] + 0x10) = local_600;
        *(undefined8 *)(local_2420[3] + 0x18) = uStack_5f8;
        *(undefined8 *)local_2420[4] = local_680;
        *(undefined8 *)(local_2420[4] + 8) = uStack_678;
        *(undefined8 *)(local_2420[4] + 0x10) = local_5a0;
        *(undefined8 *)(local_2420[4] + 0x18) = uStack_598;
        *(undefined8 *)local_2420[5] = local_620;
        *(undefined8 *)(local_2420[5] + 8) = uStack_618;
        *(undefined8 *)(local_2420[5] + 0x10) = local_6a0;
        *(undefined8 *)(local_2420[5] + 0x18) = uStack_698;
        *(undefined8 *)local_2420[6] = local_25c0;
        *(undefined8 *)(local_2420[6] + 8) = uStack_25b8;
        *(undefined8 *)(local_2420[6] + 0x10) = uStack_25b0;
        *(undefined8 *)(local_2420[6] + 0x18) = uStack_25a8;
        *(undefined8 *)local_2420[7] = local_25e0;
        *(undefined8 *)(local_2420[7] + 8) = uStack_25d8;
        *(undefined8 *)(local_2420[7] + 0x10) = uStack_25d0;
        *(undefined8 *)(local_2420[7] + 0x18) = uStack_25c8;
        *(undefined8 *)local_2420[8] = local_2600;
        *(undefined8 *)(local_2420[8] + 8) = uStack_25f8;
        *(undefined8 *)(local_2420[8] + 0x10) = uStack_25f0;
        *(undefined8 *)(local_2420[8] + 0x18) = uStack_25e8;
        *(undefined8 *)local_2420[9] = local_2620;
        *(undefined8 *)(local_2420[9] + 8) = uStack_2618;
        *(undefined8 *)(local_2420[9] + 0x10) = uStack_2610;
        *(undefined8 *)(local_2420[9] + 0x18) = uStack_2608;
        *(undefined8 *)local_2420[10] = local_2640;
        *(undefined8 *)(local_2420[10] + 8) = uStack_2638;
        *(undefined8 *)(local_2420[10] + 0x10) = uStack_2630;
        *(undefined8 *)(local_2420[10] + 0x18) = uStack_2628;
        local_2420[0xb] = auVar23;
        local_2420 = local_2420 + 0xc;
        local_2468 = local_2468 + 1;
        local_2470 = local_2470 + 1;
        local_2478 = local_2478 + 1;
        local_2480 = local_2480 + 1;
        local_2488 = local_2488 + 1;
        local_2490 = local_2490 + 1;
        local_2498 = local_2498 + 1;
        local_24a0 = local_24a0 + 1;
        local_24a8 = local_24a8 + 1;
        local_24b0 = local_24b0 + 1;
        local_24b8 = local_24b8 + 1;
        local_24c0 = local_24c0 + 1;
      }
      for (; local_24c4 + 3 < in_R9D; local_24c4 = local_24c4 + 4) {
        auVar19 = vunpcklps_avx(*(undefined1 (*) [16])*local_2468,*(undefined1 (*) [16])*local_2470)
        ;
        auVar20 = vunpcklps_avx(*(undefined1 (*) [16])*local_2478,*(undefined1 (*) [16])*local_2480)
        ;
        auVar2 = vunpckhps_avx(*(undefined1 (*) [16])*local_2468,*(undefined1 (*) [16])*local_2470);
        auVar3 = vunpckhps_avx(*(undefined1 (*) [16])*local_2478,*(undefined1 (*) [16])*local_2480);
        auVar12 = vunpcklpd_avx(auVar19,auVar20);
        auVar19 = vunpckhpd_avx(auVar19,auVar20);
        auVar13 = vunpcklpd_avx(auVar2,auVar3);
        auVar2 = vunpckhpd_avx(auVar2,auVar3);
        auVar3 = vunpcklps_avx(*(undefined1 (*) [16])*local_2488,*(undefined1 (*) [16])*local_2490);
        auVar21 = vunpcklps_avx(*(undefined1 (*) [16])*local_2498,*(undefined1 (*) [16])*local_24a0)
        ;
        auVar20 = vunpckhps_avx(*(undefined1 (*) [16])*local_2488,*(undefined1 (*) [16])*local_2490)
        ;
        auVar4 = vunpckhps_avx(*(undefined1 (*) [16])*local_2498,*(undefined1 (*) [16])*local_24a0);
        auVar14 = vunpcklpd_avx(auVar3,auVar21);
        auVar3 = vunpckhpd_avx(auVar3,auVar21);
        auVar15 = vunpcklpd_avx(auVar20,auVar4);
        auVar20 = vunpckhpd_avx(auVar20,auVar4);
        auVar4 = vunpcklps_avx(*(undefined1 (*) [16])*local_24a8,*(undefined1 (*) [16])*local_24b0);
        auVar22 = vunpcklps_avx(*(undefined1 (*) [16])*local_24b8,*(undefined1 (*) [16])*local_24c0)
        ;
        auVar21 = vunpckhps_avx(*(undefined1 (*) [16])*local_24a8,*(undefined1 (*) [16])*local_24b0)
        ;
        auVar5 = vunpckhps_avx(*(undefined1 (*) [16])*local_24b8,*(undefined1 (*) [16])*local_24c0);
        auVar16 = vunpcklpd_avx(auVar4,auVar22);
        auVar4 = vunpckhpd_avx(auVar4,auVar22);
        auVar22 = vunpcklpd_avx(auVar21,auVar5);
        auVar21 = vunpckhpd_avx(auVar21,auVar5);
        local_2670 = auVar12._0_8_;
        uStack_2668 = auVar12._8_8_;
        *(undefined8 *)*local_2420 = local_2670;
        *(undefined8 *)(*local_2420 + 8) = uStack_2668;
        local_26b0 = auVar14._0_8_;
        uStack_26a8 = auVar14._8_8_;
        *(undefined8 *)(*local_2420 + 0x10) = local_26b0;
        *(undefined8 *)(*local_2420 + 0x18) = uStack_26a8;
        local_26f0 = auVar16._0_8_;
        uStack_26e8 = auVar16._8_8_;
        *(undefined8 *)local_2420[1] = local_26f0;
        *(undefined8 *)(local_2420[1] + 8) = uStack_26e8;
        local_2680 = auVar19._0_8_;
        uStack_2678 = auVar19._8_8_;
        *(undefined8 *)(local_2420[1] + 0x10) = local_2680;
        *(undefined8 *)(local_2420[1] + 0x18) = uStack_2678;
        local_26c0 = auVar3._0_8_;
        uStack_26b8 = auVar3._8_8_;
        *(undefined8 *)local_2420[2] = local_26c0;
        *(undefined8 *)(local_2420[2] + 8) = uStack_26b8;
        local_2700 = auVar4._0_8_;
        uStack_26f8 = auVar4._8_8_;
        *(undefined8 *)(local_2420[2] + 0x10) = local_2700;
        *(undefined8 *)(local_2420[2] + 0x18) = uStack_26f8;
        local_2690 = auVar13._0_8_;
        uStack_2688 = auVar13._8_8_;
        *(undefined8 *)local_2420[3] = local_2690;
        *(undefined8 *)(local_2420[3] + 8) = uStack_2688;
        local_26d0 = auVar15._0_8_;
        uStack_26c8 = auVar15._8_8_;
        *(undefined8 *)(local_2420[3] + 0x10) = local_26d0;
        *(undefined8 *)(local_2420[3] + 0x18) = uStack_26c8;
        local_2710 = auVar22._0_8_;
        uStack_2708 = auVar22._8_8_;
        *(undefined8 *)local_2420[4] = local_2710;
        *(undefined8 *)(local_2420[4] + 8) = uStack_2708;
        local_26a0 = auVar2._0_8_;
        uStack_2698 = auVar2._8_8_;
        *(undefined8 *)(local_2420[4] + 0x10) = local_26a0;
        *(undefined8 *)(local_2420[4] + 0x18) = uStack_2698;
        local_26e0 = auVar20._0_8_;
        uStack_26d8 = auVar20._8_8_;
        *(undefined8 *)local_2420[5] = local_26e0;
        *(undefined8 *)(local_2420[5] + 8) = uStack_26d8;
        *(undefined1 (*) [16])(local_2420[5] + 0x10) = auVar21;
        local_2420 = local_2420 + 6;
        local_2468 = (undefined1 (*) [32])(*local_2468 + 0x10);
        local_2470 = (undefined1 (*) [32])(*local_2470 + 0x10);
        local_2478 = (undefined1 (*) [32])(*local_2478 + 0x10);
        local_2480 = (undefined1 (*) [32])(*local_2480 + 0x10);
        local_2488 = (undefined1 (*) [32])(*local_2488 + 0x10);
        local_2490 = (undefined1 (*) [32])(*local_2490 + 0x10);
        local_2498 = (undefined1 (*) [32])(*local_2498 + 0x10);
        local_24a0 = (undefined1 (*) [32])(*local_24a0 + 0x10);
        local_24a8 = (undefined1 (*) [32])(*local_24a8 + 0x10);
        local_24b0 = (undefined1 (*) [32])(*local_24b0 + 0x10);
        local_24b8 = (undefined1 (*) [32])(*local_24b8 + 0x10);
        local_24c0 = (undefined1 (*) [32])(*local_24c0 + 0x10);
      }
      for (; local_24c4 < in_R9D; local_24c4 = local_24c4 + 1) {
        *(undefined4 *)*local_2420 = *(undefined4 *)*local_2468;
        *(undefined4 *)(*local_2420 + 4) = *(undefined4 *)*local_2470;
        *(undefined4 *)(*local_2420 + 8) = *(undefined4 *)*local_2478;
        *(undefined4 *)(*local_2420 + 0xc) = *(undefined4 *)*local_2480;
        *(undefined4 *)(*local_2420 + 0x10) = *(undefined4 *)*local_2488;
        *(undefined4 *)(*local_2420 + 0x14) = *(undefined4 *)*local_2490;
        *(undefined4 *)(*local_2420 + 0x18) = *(undefined4 *)*local_2498;
        *(undefined4 *)(*local_2420 + 0x1c) = *(undefined4 *)*local_24a0;
        *(undefined4 *)local_2420[1] = *(undefined4 *)*local_24a8;
        *(undefined4 *)(local_2420[1] + 4) = *(undefined4 *)*local_24b0;
        *(undefined4 *)(local_2420[1] + 8) = *(undefined4 *)*local_24b8;
        *(undefined4 *)(local_2420[1] + 0xc) = *(undefined4 *)*local_24c0;
        local_2420 = (undefined1 (*) [32])(local_2420[1] + 0x10);
        local_2468 = (undefined1 (*) [32])(*local_2468 + 4);
        local_2470 = (undefined1 (*) [32])(*local_2470 + 4);
        local_2478 = (undefined1 (*) [32])(*local_2478 + 4);
        local_2480 = (undefined1 (*) [32])(*local_2480 + 4);
        local_2488 = (undefined1 (*) [32])(*local_2488 + 4);
        local_2490 = (undefined1 (*) [32])(*local_2490 + 4);
        local_2498 = (undefined1 (*) [32])(*local_2498 + 4);
        local_24a0 = (undefined1 (*) [32])(*local_24a0 + 4);
        local_24a8 = (undefined1 (*) [32])(*local_24a8 + 4);
        local_24b0 = (undefined1 (*) [32])(*local_24b0 + 4);
        local_24b8 = (undefined1 (*) [32])(*local_24b8 + 4);
        local_24c0 = (undefined1 (*) [32])(*local_24c0 + 4);
      }
    }
  }
  for (; local_2424 + 7 < in_ECX; local_2424 = local_2424 + 8) {
    if (iVar1 == 8) {
      local_27e8 = (undefined1 (*) [32])
                   (*in_RDI + (long)(((in_EDX + local_2424) / 8) * 8 * local_2c70) * 4 +
                   (long)(in_R8D << 3) * 4);
      local_27f0 = (undefined1 (*) [16])
                   (*in_RDI + (long)(((in_EDX + local_2424 + 8) / 8) * 8 * local_2c70) * 4 +
                   (long)(in_R8D << 3) * 4);
      if ((in_EDX + local_2424) % 8 == 0) {
        for (local_27f4 = 0; local_27f4 < in_R9D; local_27f4 = local_27f4 + 1) {
          *local_2420 = *local_27e8;
          local_2420 = local_2420 + 1;
          local_27e8 = local_27e8 + 1;
        }
      }
      if ((in_EDX + local_2424) % 8 == 4) {
        for (local_27f8 = 0; local_27f8 < in_R9D; local_27f8 = local_27f8 + 1) {
          uVar29 = *(undefined8 *)(*local_27e8 + 0x18);
          *(undefined8 *)*local_2420 = *(undefined8 *)(*local_27e8 + 0x10);
          *(undefined8 *)(*local_2420 + 8) = uVar29;
          *(undefined1 (*) [16])(*local_2420 + 0x10) = *local_27f0;
          local_2420 = local_2420 + 1;
          local_27e8 = local_27e8 + 1;
          local_27f0 = local_27f0 + 2;
        }
      }
    }
    if (iVar1 == 4) {
      local_2800 = (undefined8 *)
                   (*in_RDI + (long)((in_EDX + local_2424) * local_2c70) * 4 +
                   (long)(in_R8D << 2) * 4);
      local_2808 = (undefined1 (*) [16])
                   (*in_RDI + (long)((in_EDX + local_2424 + 4) * local_2c70) * 4 +
                   (long)(in_R8D << 2) * 4);
      for (local_280c = 0; local_280c < in_R9D; local_280c = local_280c + 1) {
        uVar29 = local_2800[1];
        *(undefined8 *)*local_2420 = *local_2800;
        *(undefined8 *)(*local_2420 + 8) = uVar29;
        *(undefined1 (*) [16])(*local_2420 + 0x10) = *local_2808;
        local_2420 = local_2420 + 1;
        local_2800 = local_2800 + 2;
        local_2808 = local_2808 + 1;
      }
    }
    if (iVar1 == 1) {
      local_2818 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_2424) * local_2c70) * 4 + (long)in_R8D * 4);
      local_2820 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_2424 + 1) * local_2c70) * 4 + (long)in_R8D * 4)
      ;
      local_2828 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_2424 + 2) * local_2c70) * 4 + (long)in_R8D * 4)
      ;
      local_2830 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_2424 + 3) * local_2c70) * 4 + (long)in_R8D * 4)
      ;
      local_2838 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_2424 + 4) * local_2c70) * 4 + (long)in_R8D * 4)
      ;
      local_2840 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_2424 + 5) * local_2c70) * 4 + (long)in_R8D * 4)
      ;
      local_2848 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_2424 + 6) * local_2c70) * 4 + (long)in_R8D * 4)
      ;
      local_2850 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_2424 + 7) * local_2c70) * 4 + (long)in_R8D * 4)
      ;
      for (local_2854 = 0; local_2854 + 7 < in_R9D; local_2854 = local_2854 + 8) {
        auVar23 = vunpcklps_avx(*local_2818,*local_2820);
        auVar6 = vunpckhps_avx(*local_2818,*local_2820);
        auVar11 = vunpcklps_avx(*local_2828,*local_2830);
        auVar7 = vunpckhps_avx(*local_2828,*local_2830);
        auVar24 = vunpcklps_avx(*local_2838,*local_2840);
        auVar8 = vunpckhps_avx(*local_2838,*local_2840);
        auVar18 = vunpcklps_avx(*local_2848,*local_2850);
        auVar9 = vunpckhps_avx(*local_2848,*local_2850);
        auVar10 = vunpcklpd_avx(auVar23,auVar11);
        auVar23 = vunpckhpd_avx(auVar23,auVar11);
        auVar11 = vunpcklpd_avx(auVar6,auVar7);
        auVar6 = vunpckhpd_avx(auVar6,auVar7);
        auVar17 = vunpcklpd_avx(auVar24,auVar18);
        auVar7 = vunpckhpd_avx(auVar24,auVar18);
        auVar24 = vunpcklpd_avx(auVar8,auVar9);
        auVar8 = vunpckhpd_avx(auVar8,auVar9);
        local_21c0 = auVar10._0_8_;
        uStack_21b8 = auVar10._8_8_;
        local_2240 = auVar17._0_8_;
        uStack_2238 = auVar17._8_8_;
        local_21e0 = auVar23._0_8_;
        uStack_21d8 = auVar23._8_8_;
        local_2260 = auVar7._0_8_;
        uStack_2258 = auVar7._8_8_;
        local_2200 = auVar11._0_8_;
        uStack_21f8 = auVar11._8_8_;
        local_2280 = auVar24._0_8_;
        uStack_2278 = auVar24._8_8_;
        local_2220 = auVar6._0_8_;
        uStack_2218 = auVar6._8_8_;
        local_22a0 = auVar8._0_8_;
        uStack_2298 = auVar8._8_8_;
        auVar9 = vperm2f128_avx(auVar10,auVar17,0x31);
        uStack_28e8 = auVar9._24_8_;
        uStack_28f0 = auVar9._16_8_;
        uStack_28f8 = auVar9._8_8_;
        local_2900 = auVar9._0_8_;
        auVar23 = vperm2f128_avx(auVar23,auVar7,0x31);
        uStack_2908 = auVar23._24_8_;
        uStack_2910 = auVar23._16_8_;
        uStack_2918 = auVar23._8_8_;
        local_2920 = auVar23._0_8_;
        auVar23 = vperm2f128_avx(auVar11,auVar24,0x31);
        uStack_2928 = auVar23._24_8_;
        uStack_2930 = auVar23._16_8_;
        uStack_2938 = auVar23._8_8_;
        local_2940 = auVar23._0_8_;
        auVar23 = vperm2f128_avx(auVar6,auVar8,0x31);
        *(undefined8 *)*local_2420 = local_21c0;
        *(undefined8 *)(*local_2420 + 8) = uStack_21b8;
        *(undefined8 *)(*local_2420 + 0x10) = local_2240;
        *(undefined8 *)(*local_2420 + 0x18) = uStack_2238;
        *(undefined8 *)local_2420[1] = local_21e0;
        *(undefined8 *)(local_2420[1] + 8) = uStack_21d8;
        *(undefined8 *)(local_2420[1] + 0x10) = local_2260;
        *(undefined8 *)(local_2420[1] + 0x18) = uStack_2258;
        *(undefined8 *)local_2420[2] = local_2200;
        *(undefined8 *)(local_2420[2] + 8) = uStack_21f8;
        *(undefined8 *)(local_2420[2] + 0x10) = local_2280;
        *(undefined8 *)(local_2420[2] + 0x18) = uStack_2278;
        *(undefined8 *)local_2420[3] = local_2220;
        *(undefined8 *)(local_2420[3] + 8) = uStack_2218;
        *(undefined8 *)(local_2420[3] + 0x10) = local_22a0;
        *(undefined8 *)(local_2420[3] + 0x18) = uStack_2298;
        *(undefined8 *)local_2420[4] = local_2900;
        *(undefined8 *)(local_2420[4] + 8) = uStack_28f8;
        *(undefined8 *)(local_2420[4] + 0x10) = uStack_28f0;
        *(undefined8 *)(local_2420[4] + 0x18) = uStack_28e8;
        *(undefined8 *)local_2420[5] = local_2920;
        *(undefined8 *)(local_2420[5] + 8) = uStack_2918;
        *(undefined8 *)(local_2420[5] + 0x10) = uStack_2910;
        *(undefined8 *)(local_2420[5] + 0x18) = uStack_2908;
        *(undefined8 *)local_2420[6] = local_2940;
        *(undefined8 *)(local_2420[6] + 8) = uStack_2938;
        *(undefined8 *)(local_2420[6] + 0x10) = uStack_2930;
        *(undefined8 *)(local_2420[6] + 0x18) = uStack_2928;
        local_2420[7] = auVar23;
        local_2420 = local_2420 + 8;
        local_2818 = local_2818 + 1;
        local_2820 = local_2820 + 1;
        local_2828 = local_2828 + 1;
        local_2830 = local_2830 + 1;
        local_2838 = local_2838 + 1;
        local_2840 = local_2840 + 1;
        local_2848 = local_2848 + 1;
        local_2850 = local_2850 + 1;
      }
      for (; local_2854 + 3 < in_R9D; local_2854 = local_2854 + 4) {
        auVar19 = vunpcklps_avx(*(undefined1 (*) [16])*local_2818,*(undefined1 (*) [16])*local_2820)
        ;
        auVar20 = vunpcklps_avx(*(undefined1 (*) [16])*local_2828,*(undefined1 (*) [16])*local_2830)
        ;
        auVar2 = vunpckhps_avx(*(undefined1 (*) [16])*local_2818,*(undefined1 (*) [16])*local_2820);
        auVar3 = vunpckhps_avx(*(undefined1 (*) [16])*local_2828,*(undefined1 (*) [16])*local_2830);
        auVar21 = vunpcklpd_avx(auVar19,auVar20);
        auVar19 = vunpckhpd_avx(auVar19,auVar20);
        auVar5 = vunpcklpd_avx(auVar2,auVar3);
        auVar2 = vunpckhpd_avx(auVar2,auVar3);
        auVar3 = vunpcklps_avx(*(undefined1 (*) [16])*local_2838,*(undefined1 (*) [16])*local_2840);
        auVar13 = vunpcklps_avx(*(undefined1 (*) [16])*local_2848,*(undefined1 (*) [16])*local_2850)
        ;
        auVar20 = vunpckhps_avx(*(undefined1 (*) [16])*local_2838,*(undefined1 (*) [16])*local_2840)
        ;
        auVar4 = vunpckhps_avx(*(undefined1 (*) [16])*local_2848,*(undefined1 (*) [16])*local_2850);
        auVar12 = vunpcklpd_avx(auVar3,auVar13);
        auVar3 = vunpckhpd_avx(auVar3,auVar13);
        auVar13 = vunpcklpd_avx(auVar20,auVar4);
        auVar20 = vunpckhpd_avx(auVar20,auVar4);
        local_2970 = auVar21._0_8_;
        uStack_2968 = auVar21._8_8_;
        *(undefined8 *)*local_2420 = local_2970;
        *(undefined8 *)(*local_2420 + 8) = uStack_2968;
        local_29b0 = auVar12._0_8_;
        uStack_29a8 = auVar12._8_8_;
        *(undefined8 *)(*local_2420 + 0x10) = local_29b0;
        *(undefined8 *)(*local_2420 + 0x18) = uStack_29a8;
        local_2980 = auVar19._0_8_;
        uStack_2978 = auVar19._8_8_;
        *(undefined8 *)local_2420[1] = local_2980;
        *(undefined8 *)(local_2420[1] + 8) = uStack_2978;
        local_29c0 = auVar3._0_8_;
        uStack_29b8 = auVar3._8_8_;
        *(undefined8 *)(local_2420[1] + 0x10) = local_29c0;
        *(undefined8 *)(local_2420[1] + 0x18) = uStack_29b8;
        local_2990 = auVar5._0_8_;
        uStack_2988 = auVar5._8_8_;
        *(undefined8 *)local_2420[2] = local_2990;
        *(undefined8 *)(local_2420[2] + 8) = uStack_2988;
        local_29d0 = auVar13._0_8_;
        uStack_29c8 = auVar13._8_8_;
        *(undefined8 *)(local_2420[2] + 0x10) = local_29d0;
        *(undefined8 *)(local_2420[2] + 0x18) = uStack_29c8;
        local_29a0 = auVar2._0_8_;
        uStack_2998 = auVar2._8_8_;
        *(undefined8 *)local_2420[3] = local_29a0;
        *(undefined8 *)(local_2420[3] + 8) = uStack_2998;
        *(undefined1 (*) [16])(local_2420[3] + 0x10) = auVar20;
        local_2420 = local_2420 + 4;
        local_2818 = (undefined1 (*) [32])(*local_2818 + 0x10);
        local_2820 = (undefined1 (*) [32])(*local_2820 + 0x10);
        local_2828 = (undefined1 (*) [32])(*local_2828 + 0x10);
        local_2830 = (undefined1 (*) [32])(*local_2830 + 0x10);
        local_2838 = (undefined1 (*) [32])(*local_2838 + 0x10);
        local_2840 = (undefined1 (*) [32])(*local_2840 + 0x10);
        local_2848 = (undefined1 (*) [32])(*local_2848 + 0x10);
        local_2850 = (undefined1 (*) [32])(*local_2850 + 0x10);
      }
      for (; local_2854 < in_R9D; local_2854 = local_2854 + 1) {
        *(undefined4 *)*local_2420 = *(undefined4 *)*local_2818;
        *(undefined4 *)(*local_2420 + 4) = *(undefined4 *)*local_2820;
        *(undefined4 *)(*local_2420 + 8) = *(undefined4 *)*local_2828;
        *(undefined4 *)(*local_2420 + 0xc) = *(undefined4 *)*local_2830;
        *(undefined4 *)(*local_2420 + 0x10) = *(undefined4 *)*local_2838;
        *(undefined4 *)(*local_2420 + 0x14) = *(undefined4 *)*local_2840;
        *(undefined4 *)(*local_2420 + 0x18) = *(undefined4 *)*local_2848;
        *(undefined4 *)(*local_2420 + 0x1c) = *(undefined4 *)*local_2850;
        local_2420 = local_2420 + 1;
        local_2818 = (undefined1 (*) [32])(*local_2818 + 4);
        local_2820 = (undefined1 (*) [32])(*local_2820 + 4);
        local_2828 = (undefined1 (*) [32])(*local_2828 + 4);
        local_2830 = (undefined1 (*) [32])(*local_2830 + 4);
        local_2838 = (undefined1 (*) [32])(*local_2838 + 4);
        local_2840 = (undefined1 (*) [32])(*local_2840 + 4);
        local_2848 = (undefined1 (*) [32])(*local_2848 + 4);
        local_2850 = (undefined1 (*) [32])(*local_2850 + 4);
      }
    }
  }
  for (; local_2424 + 3 < in_ECX; local_2424 = local_2424 + 4) {
    if (iVar1 == 8) {
      local_2a68 = (undefined1 (*) [16])
                   (*in_RDI + (long)(((in_EDX + local_2424) / 8) * 8 * local_2c70) * 4 +
                   (long)(in_R8D << 3) * 4);
      if ((in_EDX + local_2424) % 8 == 0) {
        for (local_2a6c = 0; local_2a6c < in_R9D; local_2a6c = local_2a6c + 1) {
          *(undefined1 (*) [16])*local_2420 = *local_2a68;
          local_2420 = (undefined1 (*) [32])(*local_2420 + 0x10);
          local_2a68 = local_2a68 + 2;
        }
      }
      if ((in_EDX + local_2424) % 8 == 4) {
        for (local_2a70 = 0; local_2a70 < in_R9D; local_2a70 = local_2a70 + 1) {
          *(undefined1 (*) [16])*local_2420 = local_2a68[1];
          local_2420 = (undefined1 (*) [32])(*local_2420 + 0x10);
          local_2a68 = local_2a68 + 2;
        }
      }
    }
    if (iVar1 == 4) {
      local_2a78 = (undefined1 (*) [16])
                   (*in_RDI + (long)((in_EDX + local_2424) * local_2c70) * 4 +
                   (long)(in_R8D << 2) * 4);
      for (local_2a7c = 0; local_2a7c < in_R9D; local_2a7c = local_2a7c + 1) {
        *(undefined1 (*) [16])*local_2420 = *local_2a78;
        local_2420 = (undefined1 (*) [32])(*local_2420 + 0x10);
        local_2a78 = local_2a78 + 1;
      }
    }
    if (iVar1 == 1) {
      local_2a88 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_2424) * local_2c70) * 4 + (long)in_R8D * 4);
      local_2a90 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_2424 + 1) * local_2c70) * 4 + (long)in_R8D * 4)
      ;
      local_2a98 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_2424 + 2) * local_2c70) * 4 + (long)in_R8D * 4)
      ;
      local_2aa0 = (undefined1 (*) [32])
                   (*in_RDI + (long)((in_EDX + local_2424 + 3) * local_2c70) * 4 + (long)in_R8D * 4)
      ;
      for (local_2aa4 = 0; local_2aa4 + 7 < in_R9D; local_2aa4 = local_2aa4 + 8) {
        auVar23 = vunpcklps_avx(*local_2a88,*local_2a90);
        auVar6 = vunpckhps_avx(*local_2a88,*local_2a90);
        auVar9 = vunpcklps_avx(*local_2a98,*local_2aa0);
        auVar7 = vunpckhps_avx(*local_2a98,*local_2aa0);
        auVar8 = vunpcklpd_avx(auVar23,auVar9);
        auVar23 = vunpckhpd_avx(auVar23,auVar9);
        auVar9 = vunpcklpd_avx(auVar6,auVar7);
        auVar6 = vunpckhpd_avx(auVar6,auVar7);
        local_13c0 = auVar8._0_8_;
        uStack_13b8 = auVar8._8_8_;
        local_13e0 = auVar23._0_8_;
        uStack_13d8 = auVar23._8_8_;
        local_1400 = auVar9._0_8_;
        uStack_13f8 = auVar9._8_8_;
        local_1420 = auVar6._0_8_;
        uStack_1418 = auVar6._8_8_;
        auVar23 = vperm2f128_avx(auVar8,auVar23,0x31);
        uStack_2b08 = auVar23._24_8_;
        uStack_2b10 = auVar23._16_8_;
        uStack_2b18 = auVar23._8_8_;
        local_2b20 = auVar23._0_8_;
        auVar23 = vperm2f128_avx(auVar9,auVar6,0x31);
        *(undefined8 *)*local_2420 = local_13c0;
        *(undefined8 *)(*local_2420 + 8) = uStack_13b8;
        *(undefined8 *)(*local_2420 + 0x10) = local_13e0;
        *(undefined8 *)(*local_2420 + 0x18) = uStack_13d8;
        *(undefined8 *)local_2420[1] = local_1400;
        *(undefined8 *)(local_2420[1] + 8) = uStack_13f8;
        *(undefined8 *)(local_2420[1] + 0x10) = local_1420;
        *(undefined8 *)(local_2420[1] + 0x18) = uStack_1418;
        *(undefined8 *)local_2420[2] = local_2b20;
        *(undefined8 *)(local_2420[2] + 8) = uStack_2b18;
        *(undefined8 *)(local_2420[2] + 0x10) = uStack_2b10;
        *(undefined8 *)(local_2420[2] + 0x18) = uStack_2b08;
        local_2420[3] = auVar23;
        local_2420 = local_2420 + 4;
        local_2a88 = local_2a88 + 1;
        local_2a90 = local_2a90 + 1;
        local_2a98 = local_2a98 + 1;
        local_2aa0 = local_2aa0 + 1;
      }
      for (; local_2aa4 + 3 < in_R9D; local_2aa4 = local_2aa4 + 4) {
        auVar19 = vunpcklps_avx(*(undefined1 (*) [16])*local_2a88,*(undefined1 (*) [16])*local_2a90)
        ;
        auVar4 = vunpcklps_avx(*(undefined1 (*) [16])*local_2a98,*(undefined1 (*) [16])*local_2aa0);
        auVar2 = vunpckhps_avx(*(undefined1 (*) [16])*local_2a88,*(undefined1 (*) [16])*local_2a90);
        auVar3 = vunpckhps_avx(*(undefined1 (*) [16])*local_2a98,*(undefined1 (*) [16])*local_2aa0);
        auVar20 = vunpcklpd_avx(auVar19,auVar4);
        auVar19 = vunpckhpd_avx(auVar19,auVar4);
        auVar4 = vunpcklpd_avx(auVar2,auVar3);
        auVar2 = vunpckhpd_avx(auVar2,auVar3);
        local_2b50 = auVar20._0_8_;
        uStack_2b48 = auVar20._8_8_;
        *(undefined8 *)*local_2420 = local_2b50;
        *(undefined8 *)(*local_2420 + 8) = uStack_2b48;
        local_2b60 = auVar19._0_8_;
        uStack_2b58 = auVar19._8_8_;
        *(undefined8 *)(*local_2420 + 0x10) = local_2b60;
        *(undefined8 *)(*local_2420 + 0x18) = uStack_2b58;
        local_2b70 = auVar4._0_8_;
        uStack_2b68 = auVar4._8_8_;
        *(undefined8 *)local_2420[1] = local_2b70;
        *(undefined8 *)(local_2420[1] + 8) = uStack_2b68;
        *(undefined1 (*) [16])(local_2420[1] + 0x10) = auVar2;
        local_2420 = local_2420 + 2;
        local_2a88 = (undefined1 (*) [32])(*local_2a88 + 0x10);
        local_2a90 = (undefined1 (*) [32])(*local_2a90 + 0x10);
        local_2a98 = (undefined1 (*) [32])(*local_2a98 + 0x10);
        local_2aa0 = (undefined1 (*) [32])(*local_2aa0 + 0x10);
      }
      for (; local_2aa4 < in_R9D; local_2aa4 = local_2aa4 + 1) {
        *(undefined4 *)*local_2420 = *(undefined4 *)*local_2a88;
        *(undefined4 *)(*local_2420 + 4) = *(undefined4 *)*local_2a90;
        *(undefined4 *)(*local_2420 + 8) = *(undefined4 *)*local_2a98;
        *(undefined4 *)(*local_2420 + 0xc) = *(undefined4 *)*local_2aa0;
        local_2420 = (undefined1 (*) [32])(*local_2420 + 0x10);
        local_2a88 = (undefined1 (*) [32])(*local_2a88 + 4);
        local_2a90 = (undefined1 (*) [32])(*local_2a90 + 4);
        local_2a98 = (undefined1 (*) [32])(*local_2a98 + 4);
        local_2aa0 = (undefined1 (*) [32])(*local_2aa0 + 4);
      }
    }
  }
  for (; local_2424 + 1 < in_ECX; local_2424 = local_2424 + 2) {
    local_2bc8 = (undefined1 (*) [32])
                 (*in_RDI + (long)((in_EDX + local_2424) * local_2c70) * 4 + (long)in_R8D * 4);
    local_2bd0 = (undefined1 (*) [32])
                 (*in_RDI + (long)((in_EDX + local_2424 + 1) * local_2c70) * 4 + (long)in_R8D * 4);
    for (local_2bd4 = 0; local_2bd4 + 7 < in_R9D; local_2bd4 = local_2bd4 + 8) {
      auVar6 = vunpcklps_avx(*local_2bc8,*local_2bd0);
      auVar23 = vunpckhps_avx(*local_2bc8,*local_2bd0);
      local_1200 = auVar6._0_8_;
      uStack_11f8 = auVar6._8_8_;
      local_1220 = auVar23._0_8_;
      uStack_1218 = auVar23._8_8_;
      auVar23 = vperm2f128_avx(auVar6,auVar23,0x31);
      *(undefined8 *)*local_2420 = local_1200;
      *(undefined8 *)(*local_2420 + 8) = uStack_11f8;
      *(undefined8 *)(*local_2420 + 0x10) = local_1220;
      *(undefined8 *)(*local_2420 + 0x18) = uStack_1218;
      local_2420[1] = auVar23;
      local_2420 = local_2420 + 2;
      local_2bc8 = local_2bc8 + 1;
      local_2bd0 = local_2bd0 + 1;
    }
    for (; local_2bd4 + 3 < in_R9D; local_2bd4 = local_2bd4 + 4) {
      auVar2 = vunpcklps_avx(*(undefined1 (*) [16])*local_2bc8,*(undefined1 (*) [16])*local_2bd0);
      auVar19 = vunpckhps_avx(*(undefined1 (*) [16])*local_2bc8,*(undefined1 (*) [16])*local_2bd0);
      local_2c50 = auVar2._0_8_;
      uStack_2c48 = auVar2._8_8_;
      *(undefined8 *)*local_2420 = local_2c50;
      *(undefined8 *)(*local_2420 + 8) = uStack_2c48;
      *(undefined1 (*) [16])(*local_2420 + 0x10) = auVar19;
      local_2420 = local_2420 + 1;
      local_2bc8 = (undefined1 (*) [32])(*local_2bc8 + 0x10);
      local_2bd0 = (undefined1 (*) [32])(*local_2bd0 + 0x10);
    }
    for (; local_2bd4 < in_R9D; local_2bd4 = local_2bd4 + 1) {
      *(undefined4 *)*local_2420 = *(undefined4 *)*local_2bc8;
      *(undefined4 *)(*local_2420 + 4) = *(undefined4 *)*local_2bd0;
      local_2420 = (undefined1 (*) [32])(*local_2420 + 8);
      local_2bc8 = (undefined1 (*) [32])(*local_2bc8 + 4);
      local_2bd0 = (undefined1 (*) [32])(*local_2bd0 + 4);
    }
  }
  for (; local_2424 < in_ECX; local_2424 = local_2424 + 1) {
    local_2c68 = (undefined1 (*) [32])
                 (*in_RDI + (long)((in_EDX + local_2424) * local_2c70) * 4 + (long)in_R8D * 4);
    for (local_2c6c = 0; local_2c6c + 7 < in_R9D; local_2c6c = local_2c6c + 8) {
      *local_2420 = *local_2c68;
      local_2420 = local_2420 + 1;
      local_2c68 = local_2c68 + 1;
    }
    for (; local_2c6c + 3 < in_R9D; local_2c6c = local_2c6c + 4) {
      *(undefined1 (*) [16])*local_2420 = *(undefined1 (*) [16])*local_2c68;
      local_2420 = (undefined1 (*) [32])(*local_2420 + 0x10);
      local_2c68 = (undefined1 (*) [32])(*local_2c68 + 0x10);
    }
    for (; local_2c6c < in_R9D; local_2c6c = local_2c6c + 1) {
      *(undefined4 *)*local_2420 = *(undefined4 *)*local_2c68;
      local_2420 = (undefined1 (*) [32])(*local_2420 + 4);
      local_2c68 = (undefined1 (*) [32])(*local_2c68 + 4);
    }
  }
  return;
}

Assistant:

static void pack_B_tile(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk)
{
    const int elempack = B.elempack;
    const int B_hstep = B.dims == 3 ? (int)B.cstep : B.w;

    float* pp = BT;

    int jj = 0;
#if __SSE2__
    for (; jj + 11 < max_jj; jj += 12)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + (j + jj) / 16 * 16 * B_hstep + k * 16;
            const float* p1 = (const float*)B + ((j + jj) / 16 * 16 + 16) * B_hstep + k * 16;

            if ((j + jj) % 16 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0));
                    _mm_store_ps(pp + 8, _mm_load_ps(p0 + 8));
                    pp += 12;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_loadu_ps(p0 + 4));
                    _mm_store_ps(pp + 8, _mm_load_ps(p0 + 12));
                    pp += 12;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 8)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0 + 8));
                    _mm_store_ps(pp + 8, _mm_load_ps(p1));
                    pp += 12;
                    p0 += 16;
                    p1 += 16;
                }
            }
            if ((j + jj) % 16 == 12)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 12));
                    _mm256_storeu_ps(pp + 4, _mm256_load_ps(p1));
                    pp += 12;
                    p0 += 16;
                    p1 += 16;
                }
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + (j + jj) / 8 * 8 * B_hstep + k * 8;
            const float* p1 = (const float*)B + ((j + jj) / 8 * 8 + 8) * B_hstep + k * 8;

            if ((j + jj) % 8 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0));
                    _mm_store_ps(pp + 8, _mm_load_ps(p1));
                    pp += 12;
                    p0 += 8;
                    p1 += 8;
                }
            }
            if ((j + jj) % 8 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 4));
                    _mm256_storeu_ps(pp + 4, _mm256_load_ps(p1));
                    pp += 12;
                    p0 += 8;
                    p1 += 8;
                }
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k * 4;
            const float* p1 = (const float*)B + (j + jj + 4) * B_hstep + k * 4;
            const float* p2 = (const float*)B + (j + jj + 8) * B_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                _mm_store_ps(pp + 4, _mm_load_ps(p1));
                _mm_store_ps(pp + 8, _mm_load_ps(p2));
                pp += 12;
                p0 += 4;
                p1 += 4;
                p2 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k;
            const float* p1 = (const float*)B + (j + jj + 1) * B_hstep + k;
            const float* p2 = (const float*)B + (j + jj + 2) * B_hstep + k;
            const float* p3 = (const float*)B + (j + jj + 3) * B_hstep + k;
            const float* p4 = (const float*)B + (j + jj + 4) * B_hstep + k;
            const float* p5 = (const float*)B + (j + jj + 5) * B_hstep + k;
            const float* p6 = (const float*)B + (j + jj + 6) * B_hstep + k;
            const float* p7 = (const float*)B + (j + jj + 7) * B_hstep + k;
            const float* p8 = (const float*)B + (j + jj + 8) * B_hstep + k;
            const float* p9 = (const float*)B + (j + jj + 9) * B_hstep + k;
            const float* pa = (const float*)B + (j + jj + 10) * B_hstep + k;
            const float* pb = (const float*)B + (j + jj + 11) * B_hstep + k;

            int kk = 0;
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                __m256 _r2 = _mm256_loadu_ps(p2);
                __m256 _r3 = _mm256_loadu_ps(p3);
                __m256 _r4 = _mm256_loadu_ps(p4);
                __m256 _r5 = _mm256_loadu_ps(p5);
                __m256 _r6 = _mm256_loadu_ps(p6);
                __m256 _r7 = _mm256_loadu_ps(p7);
                __m256 _r8 = _mm256_loadu_ps(p8);
                __m256 _r9 = _mm256_loadu_ps(p9);
                __m256 _ra = _mm256_loadu_ps(pa);
                __m256 _rb = _mm256_loadu_ps(pb);
                transpose8x12_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                _mm256_storeu_ps(pp + 8 * 2, _r2);
                _mm256_storeu_ps(pp + 8 * 3, _r3);
                _mm256_storeu_ps(pp + 8 * 4, _r4);
                _mm256_storeu_ps(pp + 8 * 5, _r5);
                _mm256_storeu_ps(pp + 8 * 6, _r6);
                _mm256_storeu_ps(pp + 8 * 7, _r7);
                _mm256_storeu_ps(pp + 8 * 8, _r8);
                _mm256_storeu_ps(pp + 8 * 9, _r9);
                _mm256_storeu_ps(pp + 8 * 10, _ra);
                _mm256_storeu_ps(pp + 8 * 11, _rb);
                pp += 96;
                p0 += 8;
                p1 += 8;
                p2 += 8;
                p3 += 8;
                p4 += 8;
                p5 += 8;
                p6 += 8;
                p7 += 8;
                p8 += 8;
                p9 += 8;
                pa += 8;
                pb += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _r2 = _mm_loadu_ps(p2);
                __m128 _r3 = _mm_loadu_ps(p3);
                __m128 _r4 = _mm_loadu_ps(p4);
                __m128 _r5 = _mm_loadu_ps(p5);
                __m128 _r6 = _mm_loadu_ps(p6);
                __m128 _r7 = _mm_loadu_ps(p7);
                __m128 _r8 = _mm_loadu_ps(p8);
                __m128 _r9 = _mm_loadu_ps(p9);
                __m128 _ra = _mm_loadu_ps(pa);
                __m128 _rb = _mm_loadu_ps(pb);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4, _r4);
                _mm_store_ps(pp + 4 * 2, _r8);
                _mm_store_ps(pp + 4 * 3, _r1);
                _mm_store_ps(pp + 4 * 4, _r5);
                _mm_store_ps(pp + 4 * 5, _r9);
                _mm_store_ps(pp + 4 * 6, _r2);
                _mm_store_ps(pp + 4 * 7, _r6);
                _mm_store_ps(pp + 4 * 8, _ra);
                _mm_store_ps(pp + 4 * 9, _r3);
                _mm_store_ps(pp + 4 * 10, _r7);
                _mm_store_ps(pp + 4 * 11, _rb);
                pp += 48;
                p0 += 4;
                p1 += 4;
                p2 += 4;
                p3 += 4;
                p4 += 4;
                p5 += 4;
                p6 += 4;
                p7 += 4;
                p8 += 4;
                p9 += 4;
                pa += 4;
                pb += 4;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp[4] = p4[0];
                pp[5] = p5[0];
                pp[6] = p6[0];
                pp[7] = p7[0];
                pp[8] = p8[0];
                pp[9] = p9[0];
                pp[10] = pa[0];
                pp[11] = pb[0];
                pp += 12;
                p0++;
                p1++;
                p2++;
                p3++;
                p4++;
                p5++;
                p6++;
                p7++;
                p8++;
                p9++;
                pa++;
                pb++;
            }
        }
    }
    for (; jj + 7 < max_jj; jj += 8)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + (j + jj) / 16 * 16 * B_hstep + k * 16;
            const float* p1 = (const float*)B + ((j + jj) / 16 * 16 + 16) * B_hstep + k * 16;

            if ((j + jj) % 16 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0));
                    pp += 8;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_loadu_ps(p0 + 4));
                    pp += 8;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 8)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0 + 8));
                    pp += 8;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 12)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 12));
                    _mm_store_ps(pp + 4, _mm_load_ps(p1));
                    pp += 8;
                    p0 += 16;
                    p1 += 16;
                }
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + (j + jj) / 8 * 8 * B_hstep + k * 8;
            const float* p1 = (const float*)B + (j + jj + 8) / 8 * 8 * B_hstep + k * 8;

            if ((j + jj) % 8 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0));
                    pp += 8;
                    p0 += 8;
                }
            }
            if ((j + jj) % 8 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 4));
                    _mm_store_ps(pp + 4, _mm_load_ps(p1));
                    pp += 8;
                    p0 += 8;
                    p1 += 8;
                }
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k * 4;
            const float* p1 = (const float*)B + (j + jj + 4) * B_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                _mm_store_ps(pp + 4, _mm_load_ps(p1));
                pp += 8;
                p0 += 4;
                p1 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k;
            const float* p1 = (const float*)B + (j + jj + 1) * B_hstep + k;
            const float* p2 = (const float*)B + (j + jj + 2) * B_hstep + k;
            const float* p3 = (const float*)B + (j + jj + 3) * B_hstep + k;
            const float* p4 = (const float*)B + (j + jj + 4) * B_hstep + k;
            const float* p5 = (const float*)B + (j + jj + 5) * B_hstep + k;
            const float* p6 = (const float*)B + (j + jj + 6) * B_hstep + k;
            const float* p7 = (const float*)B + (j + jj + 7) * B_hstep + k;

            int kk = 0;
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                __m256 _r2 = _mm256_loadu_ps(p2);
                __m256 _r3 = _mm256_loadu_ps(p3);
                __m256 _r4 = _mm256_loadu_ps(p4);
                __m256 _r5 = _mm256_loadu_ps(p5);
                __m256 _r6 = _mm256_loadu_ps(p6);
                __m256 _r7 = _mm256_loadu_ps(p7);
                transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                _mm256_storeu_ps(pp + 8 * 2, _r2);
                _mm256_storeu_ps(pp + 8 * 3, _r3);
                _mm256_storeu_ps(pp + 8 * 4, _r4);
                _mm256_storeu_ps(pp + 8 * 5, _r5);
                _mm256_storeu_ps(pp + 8 * 6, _r6);
                _mm256_storeu_ps(pp + 8 * 7, _r7);
                pp += 64;
                p0 += 8;
                p1 += 8;
                p2 += 8;
                p3 += 8;
                p4 += 8;
                p5 += 8;
                p6 += 8;
                p7 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _r2 = _mm_loadu_ps(p2);
                __m128 _r3 = _mm_loadu_ps(p3);
                __m128 _r4 = _mm_loadu_ps(p4);
                __m128 _r5 = _mm_loadu_ps(p5);
                __m128 _r6 = _mm_loadu_ps(p6);
                __m128 _r7 = _mm_loadu_ps(p7);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4, _r4);
                _mm_store_ps(pp + 4 * 2, _r1);
                _mm_store_ps(pp + 4 * 3, _r5);
                _mm_store_ps(pp + 4 * 4, _r2);
                _mm_store_ps(pp + 4 * 5, _r6);
                _mm_store_ps(pp + 4 * 6, _r3);
                _mm_store_ps(pp + 4 * 7, _r7);
                pp += 32;
                p0 += 4;
                p1 += 4;
                p2 += 4;
                p3 += 4;
                p4 += 4;
                p5 += 4;
                p6 += 4;
                p7 += 4;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp[4] = p4[0];
                pp[5] = p5[0];
                pp[6] = p6[0];
                pp[7] = p7[0];
                pp += 8;
                p0++;
                p1++;
                p2++;
                p3++;
                p4++;
                p5++;
                p6++;
                p7++;
            }
        }
    }
    for (; jj + 3 < max_jj; jj += 4)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + (j + jj) / 16 * 16 * B_hstep + k * 16;

            if ((j + jj) % 16 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0));
                    pp += 4;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 4));
                    pp += 4;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 8)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 8));
                    pp += 4;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 12)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 12));
                    pp += 4;
                    p0 += 16;
                }
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + (j + jj) / 8 * 8 * B_hstep + k * 8;

            if ((j + jj) % 8 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0));
                    pp += 4;
                    p0 += 8;
                }
            }
            if ((j + jj) % 8 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 4));
                    pp += 4;
                    p0 += 8;
                }
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                pp += 4;
                p0 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k;
            const float* p1 = (const float*)B + (j + jj + 1) * B_hstep + k;
            const float* p2 = (const float*)B + (j + jj + 2) * B_hstep + k;
            const float* p3 = (const float*)B + (j + jj + 3) * B_hstep + k;

            int kk = 0;
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                __m256 _r2 = _mm256_loadu_ps(p2);
                __m256 _r3 = _mm256_loadu_ps(p3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                _mm256_storeu_ps(pp + 16, _r2);
                _mm256_storeu_ps(pp + 24, _r3);
                pp += 32;
                p0 += 8;
                p1 += 8;
                p2 += 8;
                p3 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _r2 = _mm_loadu_ps(p2);
                __m128 _r3 = _mm_loadu_ps(p3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4, _r1);
                _mm_store_ps(pp + 8, _r2);
                _mm_store_ps(pp + 12, _r3);
                pp += 16;
                p0 += 4;
                p1 += 4;
                p2 += 4;
                p3 += 4;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp += 4;
                p0++;
                p1++;
                p2++;
                p3++;
            }
        }
    }
#endif // __SSE2__
    for (; jj + 1 < max_jj; jj += 2)
    {
        // if (elempack == 1)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k;
            const float* p1 = (const float*)B + (j + jj + 1) * B_hstep + k;

            int kk = 0;
#if __SSE2__
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                transpose8x2_ps(_r0, _r1);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                pp += 16;
                p0 += 8;
                p1 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _tmp0 = _mm_unpacklo_ps(_r0, _r1);
                __m128 _tmp1 = _mm_unpackhi_ps(_r0, _r1);
                _mm_store_ps(pp, _tmp0);
                _mm_store_ps(pp + 4, _tmp1);
                pp += 8;
                p0 += 4;
                p1 += 4;
            }
#endif // __SSE2__
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp += 2;
                p0++;
                p1++;
            }
        }
    }
    for (; jj < max_jj; jj += 1)
    {
        // if (elempack == 1)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k;

            int kk = 0;
#if __SSE2__
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                _mm256_storeu_ps(pp, _mm256_loadu_ps(p0));
                pp += 8;
                p0 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                _mm_storeu_ps(pp, _mm_loadu_ps(p0));
                pp += 4;
                p0 += 4;
            }
#endif // __SSE2__
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp += 1;
                p0++;
            }
        }
    }
}